

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeHMS(DateTime *p)

{
  int iVar1;
  double dVar2;
  
  if (p->validHMS != '\0') {
    return;
  }
  computeJD(p);
  dVar2 = (double)(int)((p->iJD + 43200000) % 86400000) / 1000.0;
  p->h = (int)dVar2 / 0xe10;
  iVar1 = (int)dVar2 % 0xe10;
  p->m = iVar1 / 0x3c;
  p->s = (double)(iVar1 % 0x3c) + (dVar2 - (double)(int)dVar2);
  p->rawS = '\0';
  p->validHMS = '\x01';
  return;
}

Assistant:

static void computeHMS(DateTime *p){
  int s;
  if( p->validHMS ) return;
  computeJD(p);
  s = (int)((p->iJD + 43200000) % 86400000);
  p->s = s/1000.0;
  s = (int)p->s;
  p->s -= s;
  p->h = s/3600;
  s -= p->h*3600;
  p->m = s/60;
  p->s += s - p->m*60;
  p->rawS = 0;
  p->validHMS = 1;
}